

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowChildOf(ImGuiWindow *window,ImGuiWindow *potential_parent,bool popup_hierarchy)

{
  ImGuiWindow *pIVar1;
  byte in_DL;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  ImGuiWindow *window_root;
  ImGuiWindow *local_10;
  bool local_1;
  
  pIVar1 = GetCombinedRootWindow(in_RDI,(bool)(in_DL & 1));
  local_10 = in_RDI;
  if (pIVar1 == in_RSI) {
    local_1 = true;
  }
  else {
    for (; local_10 != (ImGuiWindow *)0x0; local_10 = local_10->ParentWindow) {
      if (local_10 == in_RSI) {
        return true;
      }
      if (local_10 == pIVar1) {
        return false;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent, bool popup_hierarchy)
{
    ImGuiWindow* window_root = GetCombinedRootWindow(window, popup_hierarchy);
    if (window_root == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        if (window == window_root) // end of chain
            return false;
        window = window->ParentWindow;
    }
    return false;
}